

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::accumulateDerivatives
          (BeagleCPUImpl<double,_2,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (outDerivatives == (double *)0x0) {
    accumulateDerivativesDispatch1<false>
              (this,(double *)0x0,outSumDerivatives,outSumSquaredDerivatives);
    return;
  }
  if (outSumDerivatives != (double *)0x0) {
    if (outSumSquaredDerivatives != (double *)0x0) {
      uVar1 = this->kPatternCount;
      pdVar2 = this->grandNumeratorDerivTmp;
      pdVar3 = this->grandDenominatorDerivTmp;
      pdVar4 = this->gPatternWeights;
      auVar6 = ZEXT816(0) << 0x40;
      auVar7 = ZEXT816(0) << 0x40;
      uVar5 = 0;
      while ((~((int)uVar1 >> 0x1f) & uVar1) != uVar5) {
        auVar8._0_8_ = pdVar2[uVar5] / pdVar3[uVar5];
        auVar8._8_8_ = 0;
        outDerivatives[uVar5] = auVar8._0_8_;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = pdVar4[uVar5];
        uVar5 = uVar5 + 1;
        auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar10);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar8._0_8_ * auVar8._0_8_;
        auVar6 = vfmadd231sd_fma(auVar6,auVar10,auVar9);
      }
      *outSumDerivatives = auVar7._0_8_;
      *outSumSquaredDerivatives = auVar6._0_8_;
      return;
    }
    BeagleCPUImpl<double,2,0>::accumulateDerivativesImpl<true,true,false>
              ((BeagleCPUImpl<double,2,0> *)this,outDerivatives,outSumDerivatives,(double *)0x0);
    return;
  }
  BeagleCPUImpl<double,2,0>::accumulateDerivativesDispatch2<true,false>
            ((BeagleCPUImpl<double,2,0> *)this,outDerivatives,(double *)0x0,outSumSquaredDerivatives
            );
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivatives(double* outDerivatives,
                                                              double* outSumDerivatives,
                                                              double* outSumSquaredDerivatives) {
    if (outDerivatives == NULL) {
        accumulateDerivativesDispatch1<false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch1<true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}